

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int __thiscall smf::MidiFile::addTrack(MidiFile *this,int count)

{
  int iVar1;
  MidiEventList *this_00;
  reference ppMVar2;
  undefined4 local_1c;
  int i;
  int length;
  int count_local;
  MidiFile *this_local;
  
  iVar1 = getNumTracks(this);
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,(long)(iVar1 + count));
  for (local_1c = 0; local_1c < count; local_1c = local_1c + 1) {
    this_00 = (MidiEventList *)operator_new(0x18);
    MidiEventList::MidiEventList(this_00);
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)(iVar1 + local_1c));
    *ppMVar2 = this_00;
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)(iVar1 + local_1c));
    MidiEventList::reserve(*ppMVar2,10000);
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,(long)(iVar1 + local_1c));
    MidiEventList::clear(*ppMVar2);
  }
  return iVar1 + count + -1;
}

Assistant:

int MidiFile::addTrack(int count) {
	int length = getNumTracks();
	m_events.resize(length+count);
	int i;
	for (i=0; i<count; i++) {
		m_events[length + i] = new MidiEventList;
		m_events[length + i]->reserve(10000);
		m_events[length + i]->clear();
	}
	return length + count - 1;
}